

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O1

bool google::protobuf::compiler::annotation_test_util::AtLeastOneAnnotationMatchesSubstring
               (string *file_content,
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *annotations,string *expected_text,
               optional<google::protobuf::GeneratedCodeInfo_Annotation_Semantic> semantic)

{
  uint uVar1;
  pointer ppGVar2;
  GeneratedCodeInfo_Annotation *pGVar3;
  byte bVar4;
  int iVar5;
  byte unaff_R12B;
  pointer ppGVar6;
  bool bVar7;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  ppGVar2 = (annotations->
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppGVar6 = (annotations->
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppGVar6 != ppGVar2;
      ppGVar6 = ppGVar6 + 1) {
    pGVar3 = *ppGVar6;
    uVar1 = (pGVar3->field_0)._impl_.end_;
    bVar7 = false;
    if (uVar1 < (uint)(pGVar3->field_0)._impl_.begin_) {
      bVar4 = 0;
    }
    else {
      bVar4 = 0;
      if ((ulong)uVar1 <= file_content->_M_string_length) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)file_content);
        bVar7 = true;
        if (local_48 == expected_text->_M_string_length) {
          if (local_48 == 0) {
            bVar7 = false;
          }
          else {
            iVar5 = bcmp(local_50,(expected_text->_M_dataplus)._M_p,local_48);
            bVar7 = iVar5 != 0;
          }
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if ((bool)(((ulong)semantic.
                           super__Optional_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                    >> 0x20 & 1) == 0 | bVar7)) {
          bVar4 = bVar7 ^ 1U | unaff_R12B;
        }
        else {
          bVar4 = (pGVar3->field_0)._impl_.semantic_ ==
                  semantic.
                  super__Optional_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ._M_payload;
          bVar7 = false;
        }
      }
    }
    if (bVar7 == false) goto LAB_00188e34;
    unaff_R12B = bVar4;
  }
  bVar4 = 0;
LAB_00188e34:
  return (bool)(bVar4 & 1);
}

Assistant:

bool AtLeastOneAnnotationMatchesSubstring(
    const std::string& file_content,
    const std::vector<const GeneratedCodeInfo::Annotation*>& annotations,
    const std::string& expected_text,
    absl::optional<GeneratedCodeInfo::Annotation::Semantic> semantic) {
  for (std::vector<const GeneratedCodeInfo::Annotation*>::const_iterator
           i = annotations.begin(),
           e = annotations.end();
       i != e; ++i) {
    const GeneratedCodeInfo::Annotation* annotation = *i;
    uint32_t begin = annotation->begin();
    uint32_t end = annotation->end();
    if (end < begin || end > file_content.size()) {
      return false;
    }
    if (file_content.substr(begin, end - begin) == expected_text) {
      return !semantic || annotation->semantic() == *semantic;
    }
  }
  return false;
}